

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QByteArray *
QTimeZonePrivate::windowsIdToDefaultIanaId(QByteArray *__return_storage_ptr__,QByteArray *windowsId)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  storage_type *in_RCX;
  size_t __n;
  long lVar4;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  undefined2 *puVar7;
  QByteArrayView winId;
  WindowsData entry;
  
  puVar7 = &QtTimeZoneCldr::windowsDataTable;
  uVar6 = 0x8b;
  do {
    uVar5 = uVar6 >> 1;
    winId.m_data = in_RCX;
    winId.m_size = (qsizetype)(windowsId->d).ptr;
    entry.offsetFromUtc = (qint32)(windowsId->d).size;
    entry._0_8_ = *(undefined8 *)(puVar7 + uVar5 * 6);
    bVar2 = earlierWindowsId(entry,winId);
    if (bVar2) {
      puVar7 = puVar7 + uVar5 * 6 + 6;
      uVar5 = ~uVar5 + uVar6;
    }
    uVar6 = uVar5;
  } while (0 < (long)uVar5);
  if (puVar7 != (undefined2 *)&DAT_00597174) {
    __n = 0xffffffffffffffff;
    do {
      lVar4 = __n + (ulong)(ushort)puVar7[1] + 1;
      __n = __n + 1;
    } while ("Afghanistan Standard Time"[lVar4] != '\0');
    if (((windowsId->d).size == __n) &&
       ((__n == 0 ||
        (iVar3 = bcmp("Afghanistan Standard Time" + (ushort)puVar7[1],(windowsId->d).ptr,__n),
        iVar3 == 0)))) {
      lVar4 = -1;
      do {
        lVar1 = lVar4 + (ulong)(ushort)puVar7[2] + 1;
        lVar4 = lVar4 + 1;
      } while ("Africa/Asmera"[lVar1] != '\0');
      QByteArray::QByteArray(__return_storage_ptr__,"Africa/Asmera" + (ushort)puVar7[2],lVar4);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QTimeZonePrivate::windowsIdToDefaultIanaId(const QByteArray &windowsId)
{
    const auto data = std::lower_bound(std::begin(windowsDataTable), std::end(windowsDataTable),
                                       windowsId, earlierWindowsId);
    if (data != std::end(windowsDataTable) && data->windowsId() == windowsId) {
        QByteArrayView id = data->ianaId();
        Q_ASSERT(id.indexOf(' ') == -1);
        return id.toByteArray();
    }
    return QByteArray();
}